

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetObjectsNode::Evaluate
          (string *__return_storage_ptr__,TargetObjectsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  cmGlobalGenerator *pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  TargetType TVar3;
  int iVar4;
  cmGeneratorTarget *this_01;
  ostream *poVar5;
  _Alloc_hider _Var6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string reason;
  char *loc;
  string tgtName;
  char *imp;
  ostringstream e;
  allocator local_229;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  char *local_1a8;
  undefined1 local_1a0 [376];
  
  std::__cxx11::string::string
            ((string *)&local_1c8,
             (string *)
             (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  this_01 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_1c8);
  if (this_01 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    poVar5 = std::operator<<((ostream *)local_1a0,"Objects of target \"");
    poVar5 = std::operator<<(poVar5,(string *)&local_1c8);
    std::operator<<(poVar5,"\" referenced but no such target exists.");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_208,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&local_208,&local_228);
  }
  else {
    TVar3 = cmGeneratorTarget::GetType(this_01);
    if (TVar3 == OBJECT_LIBRARY) {
      if (context->EvaluateForBuildsystem == false) {
        pcVar1 = context->LG->GlobalGenerator;
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        local_208._M_string_length = 0;
        local_208.field_2._M_local_buf[0] = '\0';
        iVar4 = (*pcVar1->_vptr_cmGlobalGenerator[0x20])(pcVar1,&local_208);
        if ((char)iVar4 == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
          poVar5 = std::operator<<((ostream *)local_1a0,
                                   "The evaluation of the TARGET_OBJECTS generator expression is only suitable for consumption by CMake (limited"
                                  );
          poVar5 = std::operator<<(poVar5,(string *)&local_208);
          std::operator<<(poVar5,").  It is not suitable for writing out elsewhere.");
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_228,content);
          std::__cxx11::stringbuf::str();
          reportError(context,&local_228,&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_228);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
          std::__cxx11::string::~string((string *)&local_208);
          goto LAB_00415186;
        }
        std::__cxx11::string::~string((string *)&local_208);
      }
      local_228._M_dataplus._M_p = (pointer)0x0;
      local_228._M_string_length = 0;
      local_228.field_2._M_allocated_capacity = 0;
      bVar2 = cmGeneratorTarget::IsImported(this_01);
      if (bVar2) {
        local_1e8._M_dataplus._M_p = (char *)0x0;
        local_1a8 = (char *)0x0;
        local_1a0._0_8_ = local_1a0 + 0x10;
        local_1a0._8_8_ = 0;
        local_1a0[0x10] = '\0';
        bVar2 = cmTarget::GetMappedConfig
                          (this_01->Target,&context->Config,(char **)&local_1e8,&local_1a8,
                           (string *)local_1a0);
        if (bVar2) {
          std::__cxx11::string::string((string *)&local_208,local_1e8._M_dataplus._M_p,&local_229);
          cmSystemTools::ExpandListArgument
                    (&local_208,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_228,false);
          std::__cxx11::string::~string((string *)&local_208);
        }
        context->HadContextSensitiveCondition = true;
      }
      else {
        cmGeneratorTarget::GetTargetObjectNames
                  (this_01,&context->Config,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_228);
        local_1a0._0_8_ = local_1a0 + 0x10;
        local_1a0._8_8_ = 0;
        local_1a0[0x10] = '\0';
        if (context->EvaluateForBuildsystem == true) {
          std::__cxx11::string::_M_assign((string *)local_1a0);
        }
        else {
          cmGeneratorTarget::GetObjectDirectory(&local_208,this_01,&context->Config);
          std::__cxx11::string::operator=((string *)local_1a0,(string *)&local_208);
          std::__cxx11::string::~string((string *)&local_208);
          context->HadContextSensitiveCondition = true;
        }
        for (_Var6._M_p = local_228._M_dataplus._M_p;
            _Var6._M_p != (pointer)local_228._M_string_length; _Var6._M_p = _Var6._M_p + 0x20) {
          std::operator+(&local_208,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _Var6._M_p);
          std::__cxx11::string::operator=((string *)_Var6._M_p,(string *)&local_208);
          std::__cxx11::string::~string((string *)&local_208);
        }
      }
      std::__cxx11::string::~string((string *)local_1a0);
      this_00 = context->LG->Makefile;
      for (_Var6._M_p = local_228._M_dataplus._M_p;
          _Var6._M_p != (pointer)local_228._M_string_length; _Var6._M_p = _Var6._M_p + 0x20) {
        cmMakefile::AddTargetObject(this_00,&local_1c8,(string *)_Var6._M_p);
      }
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (__return_storage_ptr__,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_228,";");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_228);
      goto LAB_00415186;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    poVar5 = std::operator<<((ostream *)local_1a0,"Objects of target \"");
    poVar5 = std::operator<<(poVar5,(string *)&local_1c8);
    std::operator<<(poVar5,"\" referenced but is not an OBJECT library.");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_208,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&local_208,&local_228);
  }
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
LAB_00415186:
  std::__cxx11::string::~string((string *)&local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* context,
                       const GeneratorExpressionContent* content,
                       cmGeneratorExpressionDAGChecker* /*dagChecker*/) const
    CM_OVERRIDE
  {
    std::string tgtName = parameters.front();
    cmGeneratorTarget* gt = context->LG->FindGeneratorTargetToUse(tgtName);
    if (!gt) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but no such target exists.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    if (gt->GetType() != cmStateEnums::OBJECT_LIBRARY) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but is not an OBJECT library.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    if (!context->EvaluateForBuildsystem) {
      cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
      std::string reason;
      if (!gg->HasKnownObjectFileLocation(&reason)) {
        std::ostringstream e;
        e << "The evaluation of the TARGET_OBJECTS generator expression "
             "is only suitable for consumption by CMake (limited"
          << reason << ").  "
                       "It is not suitable for writing out elsewhere.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
    }

    std::vector<std::string> objects;

    if (gt->IsImported()) {
      const char* loc = CM_NULLPTR;
      const char* imp = CM_NULLPTR;
      std::string suffix;
      if (gt->Target->GetMappedConfig(context->Config, &loc, &imp, suffix)) {
        cmSystemTools::ExpandListArgument(loc, objects);
      }
      context->HadContextSensitiveCondition = true;
    } else {
      gt->GetTargetObjectNames(context->Config, objects);

      std::string obj_dir;
      if (context->EvaluateForBuildsystem) {
        // Use object file directory with buildsystem placeholder.
        obj_dir = gt->ObjectDirectory;
        // Here we assume that the set of object files produced
        // by an object library does not vary with configuration
        // and do not set HadContextSensitiveCondition to true.
      } else {
        // Use object file directory with per-config location.
        obj_dir = gt->GetObjectDirectory(context->Config);
        context->HadContextSensitiveCondition = true;
      }

      for (std::vector<std::string>::iterator oi = objects.begin();
           oi != objects.end(); ++oi) {
        *oi = obj_dir + *oi;
      }
    }

    // Create the cmSourceFile instances in the referencing directory.
    cmMakefile* mf = context->LG->GetMakefile();
    for (std::vector<std::string>::iterator oi = objects.begin();
         oi != objects.end(); ++oi) {
      mf->AddTargetObject(tgtName, *oi);
    }

    return cmJoin(objects, ";");
  }